

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O0

lws * adopt_socket_readbuf(lws *wsi,char *readbuf,size_t len)

{
  int iVar1;
  lws_dll2_owner *owner;
  pollfd *pollfd;
  int n;
  pollfd *pfd;
  lws_context_per_thread *pt;
  size_t len_local;
  char *readbuf_local;
  lws *wsi_local;
  
  if (wsi == (lws *)0x0) {
    wsi_local = (lws *)0x0;
  }
  else {
    wsi_local = wsi;
    if (((readbuf != (char *)0x0) && (len != 0)) && (wsi->position_in_fds_table != -1)) {
      owner = &((wsi->a).context)->pt[(int)wsi->tsi].dll_buflist_owner;
      iVar1 = lws_buflist_append_segment(&wsi->buflist,(uint8_t *)readbuf,len);
      if (iVar1 < 0) {
        lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"adopt skt readbuf fail");
        wsi_local = (lws *)0x0;
      }
      else {
        if (iVar1 != 0) {
          lws_dll2_add_head(&wsi->dll_buflist,owner);
        }
        if (((wsi->http).ah == (allocated_headers *)0x0) &&
           (iVar1 = lws_header_table_attach(wsi,0), iVar1 != 0)) {
          _lws_log(1,"%s: deferring handling ah\n","adopt_socket_readbuf");
        }
        else {
          _lws_log(4,"%s: calling service on readbuf ah\n","adopt_socket_readbuf");
          pollfd = (pollfd *)(&(owner[0xd].tail)->prev + wsi->position_in_fds_table);
          pollfd->revents = pollfd->revents | 1;
          _lws_log(1,"%s: calling service\n","adopt_socket_readbuf");
          iVar1 = lws_service_fd_tsi((wsi->a).context,pollfd,(int)wsi->tsi);
          if (iVar1 != 0) {
            wsi_local = (lws *)0x0;
          }
        }
      }
    }
  }
  return wsi_local;
}

Assistant:

static struct lws*
adopt_socket_readbuf(struct lws *wsi, const char *readbuf, size_t len)
{
	struct lws_context_per_thread *pt;
	struct lws_pollfd *pfd;
	int n;

	if (!wsi)
		return NULL;

	if (!readbuf || len == 0)
		return wsi;

	if (wsi->position_in_fds_table == LWS_NO_FDS_POS)
		return wsi;

	pt = &wsi->a.context->pt[(int)wsi->tsi];

	n = lws_buflist_append_segment(&wsi->buflist, (const uint8_t *)readbuf,
				       len);
	if (n < 0)
		goto bail;
	if (n)
		lws_dll2_add_head(&wsi->dll_buflist, &pt->dll_buflist_owner);

	/*
	 * we can't process the initial read data until we can attach an ah.
	 *
	 * if one is available, get it and place the data in his ah rxbuf...
	 * wsi with ah that have pending rxbuf get auto-POLLIN service.
	 *
	 * no autoservice because we didn't get a chance to attach the
	 * readbuf data to wsi or ah yet, and we will do it next if we get
	 * the ah.
	 */
	if (wsi->http.ah || !lws_header_table_attach(wsi, 0)) {

		lwsl_notice("%s: calling service on readbuf ah\n", __func__);

		/*
		 * unlike a normal connect, we have the headers already
		 * (or the first part of them anyway).
		 * libuv won't come back and service us without a network
		 * event, so we need to do the header service right here.
		 */
		pfd = &pt->fds[wsi->position_in_fds_table];
		pfd->revents |= LWS_POLLIN;
		lwsl_err("%s: calling service\n", __func__);
		if (lws_service_fd_tsi(wsi->a.context, pfd, wsi->tsi))
			/* service closed us */
			return NULL;

		return wsi;
	}
	lwsl_err("%s: deferring handling ah\n", __func__);

	return wsi;

bail:
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
			   "adopt skt readbuf fail");

	return NULL;
}